

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O1

void __thiscall
jaegertracing::thrift::DependencyConcurrentClient::send_saveDependencies
          (DependencyConcurrentClient *this,Dependencies *dependencies)

{
  TProtocol *pTVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Dependency_saveDependencies_pargs args;
  TConcurrentSendSentry sentry;
  Dependency_saveDependencies_pargs local_50;
  _func_int *local_40 [2];
  TConcurrentSendSentry local_30;
  
  apache::thrift::async::TConcurrentSendSentry::TConcurrentSendSentry(&local_30,&this->sync_);
  pTVar1 = this->oprot_;
  local_50._vptr_Dependency_saveDependencies_pargs = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"saveDependencies","");
  __n = 0;
  (*pTVar1->_vptr_TProtocol[2])(pTVar1,&local_50,4);
  __buf = extraout_RDX;
  if (local_50._vptr_Dependency_saveDependencies_pargs != local_40) {
    operator_delete(local_50._vptr_Dependency_saveDependencies_pargs);
    __buf = extraout_RDX_00;
  }
  local_50._vptr_Dependency_saveDependencies_pargs =
       (_func_int **)&PTR__Dependency_saveDependencies_pargs_00277520;
  local_50.dependencies = dependencies;
  Dependency_saveDependencies_pargs::write(&local_50,(int)this->oprot_,__buf,__n);
  (*this->oprot_->_vptr_TProtocol[3])();
  peVar2 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_TTransport[10])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar2 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_TTransport[0xb])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  apache::thrift::async::TConcurrentSendSentry::commit(&local_30);
  Dependency_saveDependencies_pargs::~Dependency_saveDependencies_pargs(&local_50);
  apache::thrift::async::TConcurrentSendSentry::~TConcurrentSendSentry(&local_30);
  return;
}

Assistant:

void DependencyConcurrentClient::send_saveDependencies(const Dependencies& dependencies)
{
  int32_t cseqid = 0;
  ::apache::thrift::async::TConcurrentSendSentry sentry(&this->sync_);
  oprot_->writeMessageBegin("saveDependencies", ::apache::thrift::protocol::T_ONEWAY, cseqid);

  Dependency_saveDependencies_pargs args;
  args.dependencies = &dependencies;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();

  sentry.commit();
}